

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O0

CBString * itemTypeToUString(CBString *__return_storage_ptr__,UINT8 type)

{
  UINT8 type_local;
  
  switch(type) {
  case '<':
    Bstrlib::CBString::CBString(__return_storage_ptr__,"Root");
    break;
  case '=':
    Bstrlib::CBString::CBString(__return_storage_ptr__,"Capsule");
    break;
  case '>':
    Bstrlib::CBString::CBString(__return_storage_ptr__,"Image");
    break;
  case '?':
    Bstrlib::CBString::CBString(__return_storage_ptr__,"Region");
    break;
  case '@':
    Bstrlib::CBString::CBString(__return_storage_ptr__,"Padding");
    break;
  case 'A':
    Bstrlib::CBString::CBString(__return_storage_ptr__,"Volume");
    break;
  case 'B':
    Bstrlib::CBString::CBString(__return_storage_ptr__,"File");
    break;
  case 'C':
    Bstrlib::CBString::CBString(__return_storage_ptr__,"Section");
    break;
  case 'D':
    Bstrlib::CBString::CBString(__return_storage_ptr__,"Free space");
    break;
  case 'E':
    Bstrlib::CBString::CBString(__return_storage_ptr__,"VSS store");
    break;
  case 'F':
    Bstrlib::CBString::CBString(__return_storage_ptr__,"VSS2 store");
    break;
  case 'G':
    Bstrlib::CBString::CBString(__return_storage_ptr__,"FTW store");
    break;
  case 'H':
    Bstrlib::CBString::CBString(__return_storage_ptr__,"FDC store");
    break;
  case 'I':
    Bstrlib::CBString::CBString(__return_storage_ptr__,"SysF store");
    break;
  case 'J':
    Bstrlib::CBString::CBString(__return_storage_ptr__,"EVSA store");
    break;
  case 'K':
    Bstrlib::CBString::CBString(__return_storage_ptr__,"FlashMap store");
    break;
  case 'L':
    Bstrlib::CBString::CBString(__return_storage_ptr__,"FlashDeviceMap store");
    break;
  case 'M':
    Bstrlib::CBString::CBString(__return_storage_ptr__,"CMDB store");
    break;
  case 'N':
    Bstrlib::CBString::CBString(__return_storage_ptr__,"NVAR GUID store");
    break;
  case 'O':
    Bstrlib::CBString::CBString(__return_storage_ptr__,"NVAR entry");
    break;
  case 'P':
    Bstrlib::CBString::CBString(__return_storage_ptr__,"VSS entry");
    break;
  case 'Q':
    Bstrlib::CBString::CBString(__return_storage_ptr__,"SysF entry");
    break;
  case 'R':
    Bstrlib::CBString::CBString(__return_storage_ptr__,"EVSA entry");
    break;
  case 'S':
    Bstrlib::CBString::CBString(__return_storage_ptr__,"FlashMap entry");
    break;
  case 'T':
    Bstrlib::CBString::CBString(__return_storage_ptr__,"FlashDeviceMap entry");
    break;
  case 'U':
    Bstrlib::CBString::CBString(__return_storage_ptr__,"Microcode");
    break;
  case 'V':
    Bstrlib::CBString::CBString(__return_storage_ptr__,"SLIC data");
    break;
  case 'W':
    Bstrlib::CBString::CBString(__return_storage_ptr__,"IFWI header");
    break;
  case 'X':
    Bstrlib::CBString::CBString(__return_storage_ptr__,"IFWI partition");
    break;
  case 'Y':
    Bstrlib::CBString::CBString(__return_storage_ptr__,"FPT store");
    break;
  case 'Z':
    Bstrlib::CBString::CBString(__return_storage_ptr__,"FPT entry");
    break;
  case '[':
    Bstrlib::CBString::CBString(__return_storage_ptr__,"FPT partition");
    break;
  case '\\':
    Bstrlib::CBString::CBString(__return_storage_ptr__,"BPDT store");
    break;
  case ']':
    Bstrlib::CBString::CBString(__return_storage_ptr__,"BPDT entry");
    break;
  case '^':
    Bstrlib::CBString::CBString(__return_storage_ptr__,"BPDT partition");
    break;
  case '_':
    Bstrlib::CBString::CBString(__return_storage_ptr__,"CPD store");
    break;
  case '`':
    Bstrlib::CBString::CBString(__return_storage_ptr__,"CPD entry");
    break;
  case 'a':
    Bstrlib::CBString::CBString(__return_storage_ptr__,"CPD partition");
    break;
  case 'b':
    Bstrlib::CBString::CBString(__return_storage_ptr__,"CPD extension");
    break;
  case 'c':
    Bstrlib::CBString::CBString(__return_storage_ptr__,"CPD SPI entry");
    break;
  case 'd':
    Bstrlib::CBString::CBString(__return_storage_ptr__,"Startup AP data");
    break;
  default:
    usprintf(__return_storage_ptr__,"Unknown %02Xh",(ulong)type);
  }
  return __return_storage_ptr__;
}

Assistant:

UString itemTypeToUString(const UINT8 type)
{
    switch (type) {
        case Types::Root:                       return UString("Root");
        case Types::Image:                      return UString("Image");
        case Types::Capsule:                    return UString("Capsule");
        case Types::Region:                     return UString("Region");
        case Types::Volume:                     return UString("Volume");
        case Types::Padding:                    return UString("Padding");
        case Types::File:                       return UString("File");
        case Types::Section:                    return UString("Section");
        case Types::FreeSpace:                  return UString("Free space");
        case Types::VssStore:                   return UString("VSS store");
        case Types::Vss2Store:                  return UString("VSS2 store");
        case Types::FtwStore:                   return UString("FTW store");
        case Types::FdcStore:                   return UString("FDC store");
        case Types::SysFStore:                  return UString("SysF store");
        case Types::EvsaStore:                  return UString("EVSA store");
        case Types::CmdbStore:                  return UString("CMDB store");
        case Types::PhoenixFlashMapStore:       return UString("FlashMap store");
        case Types::InsydeFlashDeviceMapStore:  return UString("FlashDeviceMap store");
        case Types::NvarGuidStore:              return UString("NVAR GUID store");
        case Types::NvarEntry:                  return UString("NVAR entry");
        case Types::VssEntry:                   return UString("VSS entry");
        case Types::SysFEntry:                  return UString("SysF entry");
        case Types::EvsaEntry:                  return UString("EVSA entry");
        case Types::PhoenixFlashMapEntry:       return UString("FlashMap entry");
        case Types::InsydeFlashDeviceMapEntry:  return UString("FlashDeviceMap entry");
        case Types::Microcode:                  return UString("Microcode");
        case Types::SlicData:                   return UString("SLIC data");
        case Types::FptStore:                   return UString("FPT store");
        case Types::FptEntry:                   return UString("FPT entry");
        case Types::IfwiHeader:                 return UString("IFWI header");
        case Types::IfwiPartition:              return UString("IFWI partition");
        case Types::FptPartition:               return UString("FPT partition");
        case Types::BpdtStore:                  return UString("BPDT store");
        case Types::BpdtEntry:                  return UString("BPDT entry");
        case Types::BpdtPartition:              return UString("BPDT partition");
        case Types::CpdStore:                   return UString("CPD store");
        case Types::CpdEntry:                   return UString("CPD entry");
        case Types::CpdPartition:               return UString("CPD partition");
        case Types::CpdExtension:               return UString("CPD extension");
        case Types::CpdSpiEntry:                return UString("CPD SPI entry");
        case Types::StartupApDataEntry:         return UString("Startup AP data");
    }
    
    return usprintf("Unknown %02Xh", type);
}